

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_Tt6Stretch(word t,int nVars)

{
  int iVar1;
  word wVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x30d,"word Abc_Tt6Stretch(word, int)");
  }
  iVar1 = 2;
  if (2U < (uint)nVars) {
    iVar1 = nVars;
  }
  iVar4 = 3;
  if (2U < (uint)nVars) {
    iVar4 = iVar1;
  }
  iVar1 = 4;
  if (iVar4 != 3) {
    iVar1 = iVar4;
  }
  iVar3 = 5;
  if (iVar1 != 4) {
    iVar3 = iVar1;
  }
  if (iVar3 - 5U < 2) {
    uVar7 = (uint)t;
    uVar8 = -(uVar7 & 1);
    if (nVars != 0) {
      uVar8 = uVar7;
    }
    uVar8 = (uVar8 & 3) * 5;
    if (1 < (uint)nVars) {
      uVar8 = uVar7;
    }
    uVar5 = (ulong)(uVar8 & 0xf) * 0x11;
    if (2 < (uint)nVars) {
      uVar5 = t;
    }
    uVar6 = (uVar5 & 0xff) * 0x101;
    if (iVar4 != 3) {
      uVar6 = uVar5;
    }
    uVar5 = (uVar6 & 0xffff) * 0x10001;
    if (iVar1 != 4) {
      uVar5 = uVar6;
    }
    wVar2 = (uVar5 & 0xffffffff) * 0x100000001;
    if (iVar3 != 5) {
      wVar2 = uVar5;
    }
    return wVar2;
  }
  __assert_fail("nVars == 6",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                ,0x31a,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

static inline word Abc_Tt6Stretch( word t, int nVars )
{
    assert( nVars >= 0 );
    if ( nVars == 0 )
        nVars++, t = (t & 0x1) | ((t & 0x1) << 1);
    if ( nVars == 1 )
        nVars++, t = (t & 0x3) | ((t & 0x3) << 2);
    if ( nVars == 2 )
        nVars++, t = (t & 0xF) | ((t & 0xF) << 4);
    if ( nVars == 3 )
        nVars++, t = (t & 0xFF) | ((t & 0xFF) << 8);
    if ( nVars == 4 )
        nVars++, t = (t & 0xFFFF) | ((t & 0xFFFF) << 16);
    if ( nVars == 5 )
        nVars++, t = (t & 0xFFFFFFFF) | ((t & 0xFFFFFFFF) << 32);
    assert( nVars == 6 );
    return t;
}